

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.h
# Opt level: O2

void __thiscall lzham::prefix_coding::decoder_tables::clear(decoder_tables *this)

{
  if (this->m_lookup != (uint *)0x0) {
    lzham_delete_array<unsigned_int>(this->m_lookup);
    this->m_lookup = (uint32 *)0x0;
    this->m_cur_lookup_size = 0;
  }
  if (this->m_sorted_symbol_order != (unsigned_short *)0x0) {
    lzham_delete_array<unsigned_short>(this->m_sorted_symbol_order);
    this->m_sorted_symbol_order = (uint16 *)0x0;
    this->m_cur_sorted_symbol_order_size = 0;
  }
  return;
}

Assistant:

inline void clear()
         {
            if (m_lookup)
            {
               lzham_delete_array(m_lookup);
               m_lookup = 0;
               m_cur_lookup_size = 0;
            }

            if (m_sorted_symbol_order)
            {
               lzham_delete_array(m_sorted_symbol_order);
               m_sorted_symbol_order = NULL;
               m_cur_sorted_symbol_order_size = 0;
            }
         }